

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_encrypt_buf(mbedtls_ssl_context *ssl)

{
  size_t sVar1;
  undefined8 local_ad;
  uchar pseudo_hdr [13];
  size_t i;
  size_t olen_2;
  size_t padlen;
  size_t enc_msglen_1;
  uchar *enc_msg_1;
  byte local_6e;
  int ret_2;
  undefined8 uStack_6d;
  uchar taglen;
  uchar add_data [13];
  uchar *enc_msg;
  size_t olen_1;
  size_t enc_msglen;
  size_t sStack_40;
  int ret_1;
  size_t olen;
  int local_30;
  int ret;
  int auth_done;
  mbedtls_cipher_mode_t mode;
  mbedtls_ssl_context *ssl_local;
  
  local_30 = 0;
  _auth_done = ssl;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x4d8,"=> encrypt buf");
  if ((_auth_done->session_out == (mbedtls_ssl_session *)0x0) ||
     (_auth_done->transform_out == (mbedtls_ssl_transform *)0x0)) {
    mbedtls_debug_print_msg
              (_auth_done,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x4dc,"should never happen");
    return -0x6c00;
  }
  ret = mbedtls_cipher_get_cipher_mode(&_auth_done->transform_out->cipher_ctx_enc);
  sVar1 = _auth_done->out_msglen;
  mbedtls_debug_print_buf
            (_auth_done,4,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x4e3,"before encrypt: output payload",_auth_done->out_msg,sVar1);
  if ((ret == 7) || ((ret == 2 && (_auth_done->session_out->encrypt_then_mac == 0)))) {
    if (_auth_done->minor_ver == 0) {
      ssl_mac(&_auth_done->transform_out->md_ctx_enc,_auth_done->transform_out->mac_enc,
              _auth_done->out_msg,_auth_done->out_msglen,_auth_done->out_ctr,_auth_done->out_msgtype
             );
    }
    else {
      if (_auth_done->minor_ver < 1) {
        mbedtls_debug_print_msg
                  (_auth_done,1,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0x50a,"should never happen");
        return -0x6c00;
      }
      mbedtls_md_hmac_update(&_auth_done->transform_out->md_ctx_enc,_auth_done->out_ctr,8);
      mbedtls_md_hmac_update(&_auth_done->transform_out->md_ctx_enc,_auth_done->out_hdr,3);
      mbedtls_md_hmac_update(&_auth_done->transform_out->md_ctx_enc,_auth_done->out_len,2);
      mbedtls_md_hmac_update
                (&_auth_done->transform_out->md_ctx_enc,_auth_done->out_msg,_auth_done->out_msglen);
      mbedtls_md_hmac_finish
                (&_auth_done->transform_out->md_ctx_enc,_auth_done->out_msg + _auth_done->out_msglen
                );
      mbedtls_md_hmac_reset(&_auth_done->transform_out->md_ctx_enc);
    }
    sVar1 = _auth_done->transform_out->maclen;
    mbedtls_debug_print_buf
              (_auth_done,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x510,"computed mac",_auth_done->out_msg + _auth_done->out_msglen,sVar1);
    _auth_done->out_msglen = _auth_done->transform_out->maclen + _auth_done->out_msglen;
    local_30 = local_30 + 1;
  }
  if (ret == 7) {
    sStack_40 = 0;
    mbedtls_debug_print_msg
              (_auth_done,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x522,"before encrypt: msglen = %d, including %d bytes of padding",
               _auth_done->out_msglen,sVar1 & 0xffffffff00000000);
    olen._4_4_ = mbedtls_cipher_crypt
                           (&_auth_done->transform_out->cipher_ctx_enc,
                            _auth_done->transform_out->iv_enc,_auth_done->transform_out->ivlen,
                            _auth_done->out_msg,_auth_done->out_msglen,_auth_done->out_msg,
                            &stack0xffffffffffffffc0);
    if (olen._4_4_ != 0) {
      mbedtls_debug_print_ret
                (_auth_done,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0x52a,"mbedtls_cipher_crypt",olen._4_4_);
      return olen._4_4_;
    }
    if (_auth_done->out_msglen != sStack_40) {
      mbedtls_debug_print_msg
                (_auth_done,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0x530,"should never happen");
      return -0x6c00;
    }
    olen._4_4_ = 0;
  }
  else if ((ret == 6) || (ret == 8)) {
    local_6e = 0x10;
    if ((_auth_done->transform_out->ciphersuite_info->flags & 2) != 0) {
      local_6e = 8;
    }
    uStack_6d = *(undefined8 *)_auth_done->out_ctr;
    add_data[0] = (uchar)_auth_done->out_msgtype;
    mbedtls_ssl_write_version
              (_auth_done->major_ver,_auth_done->minor_ver,
               *(uint *)&_auth_done->conf->field_0x164 >> 1 & 1,add_data + 1);
    add_data[3] = (uchar)(_auth_done->out_msglen >> 8);
    add_data[4] = (uchar)_auth_done->out_msglen;
    mbedtls_debug_print_buf
              (_auth_done,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x549,"additional data used for AEAD",(uchar *)&stack0xffffffffffffff93,0xd);
    if (_auth_done->transform_out->ivlen - _auth_done->transform_out->fixed_ivlen != 8) {
      mbedtls_debug_print_msg
                (_auth_done,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0x55c,"should never happen");
      return -0x6c00;
    }
    *(undefined8 *)(_auth_done->transform_out->iv_enc + _auth_done->transform_out->fixed_ivlen) =
         *(undefined8 *)_auth_done->out_ctr;
    *(undefined8 *)_auth_done->out_iv = *(undefined8 *)_auth_done->out_ctr;
    sVar1 = _auth_done->transform_out->ivlen - _auth_done->transform_out->fixed_ivlen;
    mbedtls_debug_print_buf
              (_auth_done,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x566,"IV used",_auth_done->out_iv,sVar1);
    add_data._5_8_ = _auth_done->out_msg;
    olen_1 = _auth_done->out_msglen;
    _auth_done->out_msglen =
         (_auth_done->transform_out->ivlen - _auth_done->transform_out->fixed_ivlen) +
         _auth_done->out_msglen;
    mbedtls_debug_print_msg
              (_auth_done,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x572,"before encrypt: msglen = %d, including %d bytes of padding",
               _auth_done->out_msglen,sVar1 & 0xffffffff00000000);
    enc_msglen._4_4_ =
         mbedtls_cipher_auth_encrypt
                   (&_auth_done->transform_out->cipher_ctx_enc,_auth_done->transform_out->iv_enc,
                    _auth_done->transform_out->ivlen,(uchar *)&stack0xffffffffffffff93,0xd,
                    (uchar *)add_data._5_8_,olen_1,(uchar *)add_data._5_8_,(size_t *)&enc_msg,
                    (uchar *)(add_data._5_8_ + olen_1),(ulong)local_6e);
    if (enc_msglen._4_4_ != 0) {
      mbedtls_debug_print_ret
                (_auth_done,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0x57f,"mbedtls_cipher_auth_encrypt",enc_msglen._4_4_);
      return enc_msglen._4_4_;
    }
    if (enc_msg != (uchar *)olen_1) {
      mbedtls_debug_print_msg
                (_auth_done,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0x585,"should never happen");
      return -0x6c00;
    }
    _auth_done->out_msglen = (ulong)local_6e + _auth_done->out_msglen;
    local_30 = local_30 + 1;
    mbedtls_debug_print_buf
              (_auth_done,4,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x58c,"after encrypt: tag",(uchar *)(add_data._5_8_ + olen_1),(ulong)local_6e);
  }
  else {
    if (ret != 2) {
      mbedtls_debug_print_msg
                (_auth_done,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0x607,"should never happen");
      return -0x6c00;
    }
    i = 0;
    olen_2 = _auth_done->transform_out->ivlen -
             (_auth_done->out_msglen + 1) % _auth_done->transform_out->ivlen;
    if (olen_2 == _auth_done->transform_out->ivlen) {
      olen_2 = 0;
    }
    pseudo_hdr[5] = '\0';
    pseudo_hdr[6] = '\0';
    pseudo_hdr[7] = '\0';
    pseudo_hdr[8] = '\0';
    pseudo_hdr[9] = '\0';
    pseudo_hdr[10] = '\0';
    pseudo_hdr[0xb] = '\0';
    pseudo_hdr[0xc] = '\0';
    for (; (ulong)pseudo_hdr._5_8_ <= olen_2; pseudo_hdr._5_8_ = pseudo_hdr._5_8_ + 1) {
      _auth_done->out_msg[_auth_done->out_msglen + pseudo_hdr._5_8_] = (uchar)olen_2;
    }
    _auth_done->out_msglen = olen_2 + 1 + _auth_done->out_msglen;
    padlen = _auth_done->out_msglen;
    enc_msglen_1 = (size_t)_auth_done->out_msg;
    if (1 < _auth_done->minor_ver) {
      enc_msg_1._4_4_ =
           (*_auth_done->conf->f_rng)
                     (_auth_done->conf->p_rng,_auth_done->transform_out->iv_enc,
                      _auth_done->transform_out->ivlen);
      if (enc_msg_1._4_4_ != 0) {
        return enc_msg_1._4_4_;
      }
      memcpy(_auth_done->out_iv,_auth_done->transform_out->iv_enc,_auth_done->transform_out->ivlen);
      enc_msglen_1 = (size_t)_auth_done->out_msg;
      padlen = _auth_done->out_msglen;
      _auth_done->out_msglen = _auth_done->transform_out->ivlen + _auth_done->out_msglen;
    }
    mbedtls_debug_print_msg
              (_auth_done,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x5c3,
               "before encrypt: msglen = %d, including %d bytes of IV and %d bytes of padding",
               _auth_done->out_msglen,_auth_done->transform_out->ivlen,olen_2 + 1);
    enc_msg_1._4_4_ =
         mbedtls_cipher_crypt
                   (&_auth_done->transform_out->cipher_ctx_enc,_auth_done->transform_out->iv_enc,
                    _auth_done->transform_out->ivlen,(uchar *)enc_msglen_1,padlen,
                    (uchar *)enc_msglen_1,&i);
    if (enc_msg_1._4_4_ != 0) {
      mbedtls_debug_print_ret
                (_auth_done,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0x5cb,"mbedtls_cipher_crypt",enc_msg_1._4_4_);
      return enc_msg_1._4_4_;
    }
    if (padlen != i) {
      mbedtls_debug_print_msg
                (_auth_done,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0x5d1,"should never happen");
      return -0x6c00;
    }
    if (_auth_done->minor_ver < 2) {
      memcpy(_auth_done->transform_out->iv_enc,(_auth_done->transform_out->cipher_ctx_enc).iv,
             _auth_done->transform_out->ivlen);
    }
    if (local_30 == 0) {
      mbedtls_debug_print_msg
                (_auth_done,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0x5ee,"using encrypt then mac");
      local_ad = *(undefined8 *)_auth_done->out_ctr;
      pseudo_hdr._0_2_ = *(undefined2 *)_auth_done->out_hdr;
      pseudo_hdr[2] = _auth_done->out_hdr[2];
      pseudo_hdr[3] = (uchar)(_auth_done->out_msglen >> 8);
      pseudo_hdr[4] = (uchar)_auth_done->out_msglen;
      mbedtls_debug_print_buf
                (_auth_done,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0x5f5,"MAC\'d meta-data",(uchar *)&local_ad,0xd);
      mbedtls_md_hmac_update(&_auth_done->transform_out->md_ctx_enc,(uchar *)&local_ad,0xd);
      mbedtls_md_hmac_update
                (&_auth_done->transform_out->md_ctx_enc,_auth_done->out_iv,_auth_done->out_msglen);
      mbedtls_md_hmac_finish
                (&_auth_done->transform_out->md_ctx_enc,_auth_done->out_iv + _auth_done->out_msglen)
      ;
      mbedtls_md_hmac_reset(&_auth_done->transform_out->md_ctx_enc);
      _auth_done->out_msglen = _auth_done->transform_out->maclen + _auth_done->out_msglen;
      local_30 = local_30 + 1;
    }
  }
  if (local_30 == 1) {
    mbedtls_debug_print_msg
              (_auth_done,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x612,"<= encrypt buf");
    ssl_local._4_4_ = 0;
  }
  else {
    mbedtls_debug_print_msg
              (_auth_done,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x60e,"should never happen");
    ssl_local._4_4_ = -0x6c00;
  }
  return ssl_local._4_4_;
}

Assistant:

static int ssl_encrypt_buf( mbedtls_ssl_context *ssl )
{
    mbedtls_cipher_mode_t mode;
    int auth_done = 0;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> encrypt buf" ) );

    if( ssl->session_out == NULL || ssl->transform_out == NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    mode = mbedtls_cipher_get_cipher_mode( &ssl->transform_out->cipher_ctx_enc );

    MBEDTLS_SSL_DEBUG_BUF( 4, "before encrypt: output payload",
                      ssl->out_msg, ssl->out_msglen );

    /*
     * Add MAC before if needed
     */
#if defined(SSL_SOME_MODES_USE_MAC)
    if( mode == MBEDTLS_MODE_STREAM ||
        ( mode == MBEDTLS_MODE_CBC
#if defined(MBEDTLS_SSL_ENCRYPT_THEN_MAC)
          && ssl->session_out->encrypt_then_mac == MBEDTLS_SSL_ETM_DISABLED
#endif
        ) )
    {
#if defined(MBEDTLS_SSL_PROTO_SSL3)
        if( ssl->minor_ver == MBEDTLS_SSL_MINOR_VERSION_0 )
        {
            ssl_mac( &ssl->transform_out->md_ctx_enc,
                      ssl->transform_out->mac_enc,
                      ssl->out_msg, ssl->out_msglen,
                      ssl->out_ctr, ssl->out_msgtype );
        }
        else
#endif
#if defined(MBEDTLS_SSL_PROTO_TLS1) || defined(MBEDTLS_SSL_PROTO_TLS1_1) || \
        defined(MBEDTLS_SSL_PROTO_TLS1_2)
        if( ssl->minor_ver >= MBEDTLS_SSL_MINOR_VERSION_1 )
        {
            mbedtls_md_hmac_update( &ssl->transform_out->md_ctx_enc, ssl->out_ctr, 8 );
            mbedtls_md_hmac_update( &ssl->transform_out->md_ctx_enc, ssl->out_hdr, 3 );
            mbedtls_md_hmac_update( &ssl->transform_out->md_ctx_enc, ssl->out_len, 2 );
            mbedtls_md_hmac_update( &ssl->transform_out->md_ctx_enc,
                             ssl->out_msg, ssl->out_msglen );
            mbedtls_md_hmac_finish( &ssl->transform_out->md_ctx_enc,
                             ssl->out_msg + ssl->out_msglen );
            mbedtls_md_hmac_reset( &ssl->transform_out->md_ctx_enc );
        }
        else
#endif
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        MBEDTLS_SSL_DEBUG_BUF( 4, "computed mac",
                       ssl->out_msg + ssl->out_msglen,
                       ssl->transform_out->maclen );

        ssl->out_msglen += ssl->transform_out->maclen;
        auth_done++;
    }
#endif /* AEAD not the only option */

    /*
     * Encrypt
     */
#if defined(MBEDTLS_ARC4_C) || defined(MBEDTLS_CIPHER_NULL_CIPHER)
    if( mode == MBEDTLS_MODE_STREAM )
    {
        int ret;
        size_t olen = 0;

        MBEDTLS_SSL_DEBUG_MSG( 3, ( "before encrypt: msglen = %d, "
                            "including %d bytes of padding",
                       ssl->out_msglen, 0 ) );

        if( ( ret = mbedtls_cipher_crypt( &ssl->transform_out->cipher_ctx_enc,
                                   ssl->transform_out->iv_enc,
                                   ssl->transform_out->ivlen,
                                   ssl->out_msg, ssl->out_msglen,
                                   ssl->out_msg, &olen ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_crypt", ret );
            return( ret );
        }

        if( ssl->out_msglen != olen )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }
    }
    else
#endif /* MBEDTLS_ARC4_C || MBEDTLS_CIPHER_NULL_CIPHER */
#if defined(MBEDTLS_GCM_C) || defined(MBEDTLS_CCM_C)
    if( mode == MBEDTLS_MODE_GCM ||
        mode == MBEDTLS_MODE_CCM )
    {
        int ret;
        size_t enc_msglen, olen;
        unsigned char *enc_msg;
        unsigned char add_data[13];
        unsigned char taglen = ssl->transform_out->ciphersuite_info->flags &
                               MBEDTLS_CIPHERSUITE_SHORT_TAG ? 8 : 16;

        memcpy( add_data, ssl->out_ctr, 8 );
        add_data[8]  = ssl->out_msgtype;
        mbedtls_ssl_write_version( ssl->major_ver, ssl->minor_ver,
                           ssl->conf->transport, add_data + 9 );
        add_data[11] = ( ssl->out_msglen >> 8 ) & 0xFF;
        add_data[12] = ssl->out_msglen & 0xFF;

        MBEDTLS_SSL_DEBUG_BUF( 4, "additional data used for AEAD",
                       add_data, 13 );

        /*
         * Generate IV
         */
#if defined(MBEDTLS_SSL_AEAD_RANDOM_IV)
        ret = ssl->conf->f_rng( ssl->conf->p_rng,
                ssl->transform_out->iv_enc + ssl->transform_out->fixed_ivlen,
                ssl->transform_out->ivlen - ssl->transform_out->fixed_ivlen );
        if( ret != 0 )
            return( ret );

        memcpy( ssl->out_iv,
                ssl->transform_out->iv_enc + ssl->transform_out->fixed_ivlen,
                ssl->transform_out->ivlen - ssl->transform_out->fixed_ivlen );
#else
        if( ssl->transform_out->ivlen - ssl->transform_out->fixed_ivlen != 8 )
        {
            /* Reminder if we ever add an AEAD mode with a different size */
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        memcpy( ssl->transform_out->iv_enc + ssl->transform_out->fixed_ivlen,
                             ssl->out_ctr, 8 );
        memcpy( ssl->out_iv, ssl->out_ctr, 8 );
#endif

        MBEDTLS_SSL_DEBUG_BUF( 4, "IV used", ssl->out_iv,
                ssl->transform_out->ivlen - ssl->transform_out->fixed_ivlen );

        /*
         * Fix pointer positions and message length with added IV
         */
        enc_msg = ssl->out_msg;
        enc_msglen = ssl->out_msglen;
        ssl->out_msglen += ssl->transform_out->ivlen -
                           ssl->transform_out->fixed_ivlen;

        MBEDTLS_SSL_DEBUG_MSG( 3, ( "before encrypt: msglen = %d, "
                            "including %d bytes of padding",
                       ssl->out_msglen, 0 ) );

        /*
         * Encrypt and authenticate
         */
        if( ( ret = mbedtls_cipher_auth_encrypt( &ssl->transform_out->cipher_ctx_enc,
                                         ssl->transform_out->iv_enc,
                                         ssl->transform_out->ivlen,
                                         add_data, 13,
                                         enc_msg, enc_msglen,
                                         enc_msg, &olen,
                                         enc_msg + enc_msglen, taglen ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_auth_encrypt", ret );
            return( ret );
        }

        if( olen != enc_msglen )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        ssl->out_msglen += taglen;
        auth_done++;

        MBEDTLS_SSL_DEBUG_BUF( 4, "after encrypt: tag", enc_msg + enc_msglen, taglen );
    }
    else
#endif /* MBEDTLS_GCM_C || MBEDTLS_CCM_C */
#if defined(MBEDTLS_CIPHER_MODE_CBC) &&                                    \
    ( defined(MBEDTLS_AES_C) || defined(MBEDTLS_CAMELLIA_C) )
    if( mode == MBEDTLS_MODE_CBC )
    {
        int ret;
        unsigned char *enc_msg;
        size_t enc_msglen, padlen, olen = 0, i;

        padlen = ssl->transform_out->ivlen - ( ssl->out_msglen + 1 ) %
                 ssl->transform_out->ivlen;
        if( padlen == ssl->transform_out->ivlen )
            padlen = 0;

        for( i = 0; i <= padlen; i++ )
            ssl->out_msg[ssl->out_msglen + i] = (unsigned char) padlen;

        ssl->out_msglen += padlen + 1;

        enc_msglen = ssl->out_msglen;
        enc_msg = ssl->out_msg;

#if defined(MBEDTLS_SSL_PROTO_TLS1_1) || defined(MBEDTLS_SSL_PROTO_TLS1_2)
        /*
         * Prepend per-record IV for block cipher in TLS v1.1 and up as per
         * Method 1 (6.2.3.2. in RFC4346 and RFC5246)
         */
        if( ssl->minor_ver >= MBEDTLS_SSL_MINOR_VERSION_2 )
        {
            /*
             * Generate IV
             */
            ret = ssl->conf->f_rng( ssl->conf->p_rng, ssl->transform_out->iv_enc,
                                  ssl->transform_out->ivlen );
            if( ret != 0 )
                return( ret );

            memcpy( ssl->out_iv, ssl->transform_out->iv_enc,
                    ssl->transform_out->ivlen );

            /*
             * Fix pointer positions and message length with added IV
             */
            enc_msg = ssl->out_msg;
            enc_msglen = ssl->out_msglen;
            ssl->out_msglen += ssl->transform_out->ivlen;
        }
#endif /* MBEDTLS_SSL_PROTO_TLS1_1 || MBEDTLS_SSL_PROTO_TLS1_2 */

        MBEDTLS_SSL_DEBUG_MSG( 3, ( "before encrypt: msglen = %d, "
                            "including %d bytes of IV and %d bytes of padding",
                            ssl->out_msglen, ssl->transform_out->ivlen,
                            padlen + 1 ) );

        if( ( ret = mbedtls_cipher_crypt( &ssl->transform_out->cipher_ctx_enc,
                                   ssl->transform_out->iv_enc,
                                   ssl->transform_out->ivlen,
                                   enc_msg, enc_msglen,
                                   enc_msg, &olen ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_cipher_crypt", ret );
            return( ret );
        }

        if( enc_msglen != olen )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

#if defined(MBEDTLS_SSL_PROTO_SSL3) || defined(MBEDTLS_SSL_PROTO_TLS1)
        if( ssl->minor_ver < MBEDTLS_SSL_MINOR_VERSION_2 )
        {
            /*
             * Save IV in SSL3 and TLS1
             */
            memcpy( ssl->transform_out->iv_enc,
                    ssl->transform_out->cipher_ctx_enc.iv,
                    ssl->transform_out->ivlen );
        }
#endif

#if defined(MBEDTLS_SSL_ENCRYPT_THEN_MAC)
        if( auth_done == 0 )
        {
            /*
             * MAC(MAC_write_key, seq_num +
             *     TLSCipherText.type +
             *     TLSCipherText.version +
             *     length_of( (IV +) ENC(...) ) +
             *     IV + // except for TLS 1.0
             *     ENC(content + padding + padding_length));
             */
            unsigned char pseudo_hdr[13];

            MBEDTLS_SSL_DEBUG_MSG( 3, ( "using encrypt then mac" ) );

            memcpy( pseudo_hdr +  0, ssl->out_ctr, 8 );
            memcpy( pseudo_hdr +  8, ssl->out_hdr, 3 );
            pseudo_hdr[11] = (unsigned char)( ( ssl->out_msglen >> 8 ) & 0xFF );
            pseudo_hdr[12] = (unsigned char)( ( ssl->out_msglen      ) & 0xFF );

            MBEDTLS_SSL_DEBUG_BUF( 4, "MAC'd meta-data", pseudo_hdr, 13 );

            mbedtls_md_hmac_update( &ssl->transform_out->md_ctx_enc, pseudo_hdr, 13 );
            mbedtls_md_hmac_update( &ssl->transform_out->md_ctx_enc,
                             ssl->out_iv, ssl->out_msglen );
            mbedtls_md_hmac_finish( &ssl->transform_out->md_ctx_enc,
                             ssl->out_iv + ssl->out_msglen );
            mbedtls_md_hmac_reset( &ssl->transform_out->md_ctx_enc );

            ssl->out_msglen += ssl->transform_out->maclen;
            auth_done++;
        }
#endif /* MBEDTLS_SSL_ENCRYPT_THEN_MAC */
    }
    else
#endif /* MBEDTLS_CIPHER_MODE_CBC &&
          ( MBEDTLS_AES_C || MBEDTLS_CAMELLIA_C ) */
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    /* Make extra sure authentication was performed, exactly once */
    if( auth_done != 1 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
        return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= encrypt buf" ) );

    return( 0 );
}